

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhInstallCell(lhcell *pCell)

{
  lhpage *plVar1;
  lhcell *plVar2;
  lhcell *plVar3;
  sxu32 sVar4;
  lhcell **pplVar5;
  lhcell **pplVar6;
  uint uVar7;
  ulong uVar8;
  lhcell **pplVar9;
  sxu32 sVar10;
  
  plVar1 = pCell->pPage->pMaster;
  if (plVar1->nCell == 0) {
    pplVar5 = (lhcell **)SyMemBackendAlloc(&plVar1->pHash->sAllocator,0x100);
    if (pplVar5 == (lhcell **)0x0) {
      return -1;
    }
    uVar8 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)pplVar5 + uVar8 + 4) = 0;
      uVar8 = uVar8 + 4;
    } while (uVar8 < 0xfc);
    plVar1->apCell = pplVar5;
    plVar1->nCellSize = 0x20;
    sVar10 = 0x20;
  }
  else {
    sVar10 = plVar1->nCellSize;
    pplVar5 = plVar1->apCell;
  }
  uVar7 = sVar10 - 1 & pCell->nHash;
  plVar2 = pplVar5[uVar7];
  pCell->pNextCol = plVar2;
  if (plVar2 != (lhcell *)0x0) {
    plVar2->pPrevCol = pCell;
  }
  pplVar5[uVar7] = pCell;
  pplVar5 = &plVar1->pList;
  if (plVar1->pFirst == (lhcell *)0x0) {
    pplVar9 = &plVar1->pFirst;
  }
  else {
    plVar2 = *pplVar5;
    pplVar9 = pplVar5;
    if (plVar2 == (lhcell *)0x0) goto LAB_001140c5;
    pCell->pNext = plVar2;
    pplVar5 = &plVar2->pPrev;
  }
  *pplVar5 = pCell;
LAB_001140c5:
  *pplVar9 = pCell;
  uVar7 = plVar1->nCell + 1;
  plVar1->nCell = uVar7;
  if (uVar7 < 100000 && sVar10 * 3 <= uVar7) {
    pplVar5 = (lhcell **)SyMemBackendAlloc(&plVar1->pHash->sAllocator,sVar10 << 4);
    if (pplVar5 != (lhcell **)0x0) {
      if ((sVar10 & 0xfffffff) != 0) {
        pplVar6 = (lhcell **)((long)pplVar5 + (ulong)(sVar10 << 4));
        pplVar9 = pplVar5;
        do {
          *(undefined1 *)pplVar9 = 0;
          if (pplVar6 <= (lhcell **)((long)pplVar9 + 1)) break;
          *(undefined1 *)((long)pplVar9 + 1) = 0;
          if (pplVar6 <= (lhcell **)((long)pplVar9 + 2)) break;
          *(undefined1 *)((long)pplVar9 + 2) = 0;
          if (pplVar6 <= (lhcell **)((long)pplVar9 + 3)) break;
          *(undefined1 *)((long)pplVar9 + 3) = 0;
          pplVar9 = (lhcell **)((long)pplVar9 + 4);
        } while (pplVar9 < pplVar6);
      }
      sVar4 = plVar1->nCell;
      if (sVar4 != 0) {
        pplVar9 = &plVar1->pList;
        do {
          plVar2 = *pplVar9;
          plVar2->pNextCol = (lhcell *)0x0;
          plVar2->pPrevCol = (lhcell *)0x0;
          uVar7 = plVar2->nHash & sVar10 * 2 - 1;
          plVar3 = pplVar5[uVar7];
          plVar2->pNextCol = plVar3;
          if (plVar3 != (lhcell *)0x0) {
            plVar3->pPrevCol = plVar2;
          }
          pplVar5[uVar7] = plVar2;
          pplVar9 = &plVar2->pNext;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      SyMemBackendFree(&plVar1->pHash->sAllocator,plVar1->apCell);
      plVar1->apCell = pplVar5;
      plVar1->nCellSize = sVar10 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhInstallCell(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	sxu32 iBucket;
	if( pPage->nCell < 1 ){
		sxu32 nTableSize = 32; /* Must be a power of two */
		lhcell **apTable;
		/* Allocate a new cell table */
		apTable = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nTableSize * sizeof(lhcell *));
		if( apTable == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Zero the new table */
		SyZero((void *)apTable, nTableSize * sizeof(lhcell *));
		/* Install it */
		pPage->apCell = apTable;
		pPage->nCellSize = nTableSize;
	}
	iBucket = pCell->nHash & (pPage->nCellSize - 1);
	pCell->pNextCol = pPage->apCell[iBucket];
	if( pPage->apCell[iBucket] ){
		pPage->apCell[iBucket]->pPrevCol = pCell;
	}
	pPage->apCell[iBucket] = pCell;
	if( pPage->pFirst == 0 ){
		pPage->pFirst = pPage->pList = pCell;
	}else{
		MACRO_LD_PUSH(pPage->pList,pCell);
	}
	pPage->nCell++;
	if( (pPage->nCell >= pPage->nCellSize * 3) && pPage->nCell < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pPage->nCellSize << 1;
		lhcell *pEntry;
		lhcell **apNew;
		sxu32 n;
		
		apNew = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nNewSize * sizeof(lhcell *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhcell *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPage->pList;
			for(;;){
				/* Loop one */
				if( n >= pPage->nCell ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pPage->pHash->sAllocator,(void *)pPage->apCell);
			pPage->apCell = apNew;
			pPage->nCellSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}